

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::eliminate_split(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  long local_40;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar13 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 3;
    uVar10 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10]->type);
      if (iVar5 == 0) {
        pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        lVar14 = *(long *)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
        lVar8 = (long)*(pointer *)
                       ((long)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) - lVar14;
        if (lVar8 == 0) {
          local_40 = -1;
        }
        else {
          lVar8 = lVar8 >> 2;
          uVar9 = 0xffffffff;
          uVar11 = 0;
          uVar12 = 0;
          do {
            bVar15 = (((this->super_ModelWriter).blobs)->
                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                     super__Vector_impl_data._M_start[*(int *)(lVar14 + uVar12 * 4)].consumer != -1;
            if (bVar15) {
              uVar9 = uVar12 & 0xffffffff;
            }
            uVar11 = uVar11 + bVar15;
            uVar12 = uVar12 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != uVar12);
          if (1 < uVar11) goto LAB_00169ba8;
          local_40 = (long)(int)uVar9;
        }
        iVar5 = (int)uVar10;
        uVar11 = iVar5 - 1;
        if ((int)uVar11 < 0) {
          lVar14 = -4;
        }
        else {
          iVar1 = *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = uVar10 & 0xffffffff;
          do {
            uVar12 = (ulong)uVar11;
            iVar5 = (int)uVar9;
            iVar6 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar12]->type);
            if (iVar6 != 0) {
              pLVar4 = (((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
              lVar14 = *(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data;
              lVar8 = (long)*(pointer *)
                             ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + 8) - lVar14;
              if (lVar8 != 0) {
                lVar8 = lVar8 >> 2;
                lVar7 = 0;
                do {
                  if (*(int *)(lVar14 + lVar7 * 4) == iVar1) {
                    if ((int)lVar7 != -1) goto LAB_00169b7d;
                    break;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
              }
            }
            bVar15 = 0 < (int)uVar11;
            uVar9 = uVar12;
            uVar11 = uVar11 - 1;
          } while (bVar15);
          lVar7 = -1;
          uVar11 = 0xffffffff;
          iVar5 = 0;
LAB_00169b7d:
          lVar14 = (long)(int)lVar7 << 2;
        }
        if (iVar5 != 0) {
          pLVar4 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar11];
          fprintf(_stderr,"eliminate_split %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                  (pLVar3->name)._M_dataplus._M_p);
          iVar5 = *(int *)(*(long *)&(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + local_40 * 4);
          *(int *)(*(long *)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + lVar14) = iVar5;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar5].producer = uVar11;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x52219a);
        }
      }
LAB_00169ba8:
      uVar10 = uVar10 + 1;
    } while (uVar10 != lVar13 + (ulong)(lVar13 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_split()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Split")
            continue;

        ncnn::Layer* split = layers[i];

        int real_split_output_count = 0;
        int real_split_top_blob_index = -1;
        size_t top_blob_count = split->tops.size();
        for (size_t j = 0; j < top_blob_count; j++)
        {
            int top_blob_index_final = split->tops[j];
            if (blobs[top_blob_index_final].consumer != -1)
            {
                real_split_output_count += 1;
                real_split_top_blob_index = j;
            }
        }

        if (real_split_output_count > 1)
            continue;

        // Any - Pooling
        int bottom_blob_index = split->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (size_t k = 0; k < layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_split %s %s\n", any->name.c_str(), split->name.c_str());

        int top_blob_index_final = split->tops[real_split_top_blob_index];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        split->type = "ncnnfused";
    }

    return 0;
}